

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

Value * __thiscall
BasicBlock::GetValueForConditionalBranch
          (BasicBlock *this,BranchInstr *branch,Opnd *opnd,GlobOpt *globOpt,
          GlobHashTable *localSymToValueMap)

{
  BOOLEAN BVar1;
  SymID i;
  StackSym *pSVar2;
  Value *pVVar3;
  Loop *pLVar4;
  
  if ((opnd != (Opnd *)0x0) && (pSVar2 = IR::Opnd::GetStackSym(opnd), pSVar2 != (StackSym *)0x0)) {
    pSVar2 = IR::Opnd::GetStackSym(opnd);
    pVVar3 = FindValueInLocalThenGlobalValueTableAndUpdate
                       (this,globOpt,localSymToValueMap,&branch->super_Instr,(Sym *)0x0,
                        &pSVar2->super_Sym);
    if (pVVar3 == (Value *)0x0) {
      return (Value *)0x0;
    }
    if (this->loop == (Loop *)0x0) {
      return pVVar3;
    }
    i = GlobOpt::GetVarSymID(globOpt,pSVar2);
    if (i == (pSVar2->super_Sym).m_id) {
      return pVVar3;
    }
    pLVar4 = this->loop;
    BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(pLVar4->symsAssignedToInLoop,i);
    if (BVar1 == '\0') {
      do {
        pLVar4 = pLVar4->parent;
        if (pLVar4 == (Loop *)0x0) {
          return pVVar3;
        }
        BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(pLVar4->symsAssignedToInLoop,i);
      } while (BVar1 == '\0');
      if (pLVar4 == (Loop *)0x0) {
        return pVVar3;
      }
    }
  }
  return (Value *)0x0;
}

Assistant:

Value* BasicBlock::GetValueForConditionalBranch(
    IR::BranchInstr* branch,
    IR::Opnd* opnd,
    GlobOpt* globOpt,
    GlobHashTable* localSymToValueMap)
{
    if (!opnd || !opnd->GetStackSym())
    {
        return nullptr;
    }

    StackSym* sym = opnd->GetStackSym();

    Value* val = FindValueInLocalThenGlobalValueTableAndUpdate(
        globOpt,
        localSymToValueMap,
        branch,
        nullptr,
        sym);

    if (val != nullptr && this->loop)
    {
        // If this branch is within a loop, the stack sym is type specialized, and the associated
        // var sym is written to within the loop, then we cannot prove the condition: additional
        // assignments to the type specialized sym might be inserted in a later block.
        SymID varSymID = globOpt->GetVarSymID(sym);
        if (varSymID != sym->m_id && this->loop->IsSymAssignedToInSelfOrParents(varSymID))
        {
            return nullptr;
        }
    }

    return val;
}